

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O0

void get_gym_info(header_t *h,long length,track_info_t *out)

{
  blargg_ulong bVar1;
  int iVar2;
  char *out_00;
  char *in_RDX;
  long in_RSI;
  int *in_RDI;
  long loop;
  
  if (*in_RDI == 0x584d5947) {
    out_00 = (char *)((in_RSI * 0x32) / 3);
    bVar1 = get_le32(in_RDI + 0x69);
    if ((ulong)bVar1 == 0) {
      *(char **)(in_RDX + 8) = out_00;
      *(char **)(in_RDX + 0x10) = out_00;
      in_RDX[0x18] = '\0';
      in_RDX[0x19] = '\0';
      in_RDX[0x1a] = '\0';
      in_RDX[0x1b] = '\0';
      in_RDX[0x1c] = '\0';
      in_RDX[0x1d] = '\0';
      in_RDX[0x1e] = '\0';
      in_RDX[0x1f] = '\0';
    }
    else {
      *(ulong *)(in_RDX + 0x10) = ((ulong)bVar1 * 0x32) / 3;
      *(long *)(in_RDX + 0x18) = (long)out_00 - *(long *)(in_RDX + 0x10);
    }
    iVar2 = strcmp((char *)(in_RDI + 1),"Unknown Song");
    if (iVar2 != 0) {
      Gme_File::copy_field_(out_00,in_RDX,0);
    }
    iVar2 = strcmp((char *)(in_RDI + 9),"Unknown Game");
    if (iVar2 != 0) {
      Gme_File::copy_field_(out_00,in_RDX,0);
    }
    iVar2 = strcmp((char *)(in_RDI + 0x11),"Unknown Publisher");
    if (iVar2 != 0) {
      Gme_File::copy_field_(out_00,in_RDX,0);
    }
    iVar2 = strcmp((char *)(in_RDI + 0x21),"Unknown Person");
    if (iVar2 != 0) {
      Gme_File::copy_field_(out_00,in_RDX,0);
    }
    iVar2 = strcmp((char *)(in_RDI + 0x29),"Header added by YMAMP");
    if (iVar2 != 0) {
      Gme_File::copy_field_(out_00,in_RDX,0);
    }
  }
  return;
}

Assistant:

static void get_gym_info( Gym_Emu::header_t const& h, long length, track_info_t* out )
{
	if ( !memcmp( h.tag, "GYMX", 4 ) )
	{
		length = length * 50 / 3; // 1000 / 60
		long loop = get_le32( h.loop_start );
		if ( loop )
		{
			out->intro_length = loop * 50 / 3;
			out->loop_length  = length - out->intro_length;
		}
		else
		{
			out->length = length;
			out->intro_length = length; // make it clear that track is no longer than length
			out->loop_length = 0;
		}
		
		// more stupidity where the field should have been left
		if ( strcmp( h.song, "Unknown Song" ) )
			GME_COPY_FIELD( h, out, song );
		
		if ( strcmp( h.game, "Unknown Game" ) )
			GME_COPY_FIELD( h, out, game );
		
		if ( strcmp( h.copyright, "Unknown Publisher" ) )
			GME_COPY_FIELD( h, out, copyright );
		
		if ( strcmp( h.dumper, "Unknown Person" ) )
			GME_COPY_FIELD( h, out, dumper );
		
		if ( strcmp( h.comment, "Header added by YMAMP" ) )
			GME_COPY_FIELD( h, out, comment );
	}
}